

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxStaticArray::Emit(FxStaticArray *this,VMFunctionBuilder *build)

{
  BYTE BVar1;
  FxExpression **ppFVar2;
  long lVar3;
  PString *pPVar4;
  PInt *pPVar5;
  FxStaticArray *pFVar6;
  uint uVar7;
  ExpEmit EVar8;
  FString *pFVar9;
  FString FVar10;
  int iVar11;
  long lVar12;
  TArray<int,_int> cvalues;
  FString local_70;
  TArray<FString,_FString> local_68;
  FxStaticArray *local_50;
  VMFunctionBuilder *local_48;
  char *local_40;
  
  local_50 = this;
  local_48 = build;
  switch(this->ElementType->RegType) {
  case '\0':
    local_68.Array = (FString *)0x0;
    local_68.Most = 0;
    local_68.Count = 0;
    ppFVar2 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    uVar7 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    lVar12 = 0;
    do {
      lVar3 = *(long *)((long)ppFVar2 + lVar12);
      pPVar4 = *(PString **)(lVar3 + 0x28);
      pFVar9 = (FString *)(lVar3 + 0x30);
      if (pPVar4 == TypeString) {
        FString::AttachToOther(&local_70,pFVar9);
      }
      else {
        local_70.Chars = pFVar9->Chars;
      }
      BVar1 = (pPVar4->super_PBasicType).super_PType.RegType;
      if (BVar1 == '\x01') {
        iVar11 = (int)(double)local_70.Chars;
      }
      else {
        iVar11 = 0;
        if (BVar1 == '\0') {
          iVar11 = (int)local_70.Chars;
        }
      }
      TArray<int,_int>::Grow((TArray<int,_int> *)&local_68,1);
      *(int *)((long)&(local_68.Array)->Chars + (ulong)local_68.Count * 4) = iVar11;
      local_68.Count = local_68.Count + 1;
      if (pPVar4 == TypeString) {
        FString::~FString(&local_70);
      }
      lVar12 = lVar12 + 8;
    } while ((ulong)uVar7 << 3 != lVar12);
    uVar7 = VMFunctionBuilder::AllocConstantsInt(local_48,local_68.Count,(int *)local_68.Array);
    (local_50->super_FxLocalVariableDeclaration).StackOffset = uVar7;
    TArray<int,_int>::~TArray((TArray<int,_int> *)&local_68);
    break;
  case '\x01':
    local_68.Array = (FString *)0x0;
    local_68.Most = 0;
    local_68.Count = 0;
    ppFVar2 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    uVar7 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    lVar12 = 0;
    do {
      lVar3 = *(long *)((long)ppFVar2 + lVar12);
      pPVar5 = *(PInt **)(lVar3 + 0x28);
      pFVar9 = (FString *)(lVar3 + 0x30);
      if (pPVar5 == (PInt *)TypeString) {
        FString::AttachToOther(&local_70,pFVar9);
      }
      else {
        local_70.Chars = pFVar9->Chars;
      }
      local_40 = local_70.Chars;
      if ((pPVar5->field_0x6b != '\x01') && (local_40 = (char *)0x0, pPVar5->field_0x6b == '\0')) {
        if (pPVar5 == TypeUInt32) {
          local_40 = (char *)(double)((ulong)local_70.Chars & 0xffffffff);
        }
        else {
          local_40 = (char *)(double)(int)local_70.Chars;
        }
      }
      TArray<double,_double>::Grow((TArray<double,_double> *)&local_68,1);
      local_68.Array[local_68.Count].Chars = local_40;
      local_68.Count = local_68.Count + 1;
      if (pPVar5 == (PInt *)TypeString) {
        FString::~FString(&local_70);
      }
      lVar12 = lVar12 + 8;
    } while ((ulong)uVar7 << 3 != lVar12);
    uVar7 = VMFunctionBuilder::AllocConstantsFloat(local_48,local_68.Count,(double *)local_68.Array)
    ;
    (local_50->super_FxLocalVariableDeclaration).StackOffset = uVar7;
    TArray<double,_double>::~TArray((TArray<double,_double> *)&local_68);
    break;
  case '\x02':
    local_68.Array = (FString *)0x0;
    local_68.Most = 0;
    local_68.Count = 0;
    ppFVar2 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    uVar7 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    lVar12 = 0;
    do {
      lVar3 = *(long *)((long)ppFVar2 + lVar12);
      pPVar4 = *(PString **)(lVar3 + 0x28);
      pFVar9 = (FString *)(lVar3 + 0x30);
      if (pPVar4 == TypeString) {
        FString::AttachToOther(&local_70,pFVar9);
      }
      else {
        local_70.Chars = pFVar9->Chars;
      }
      ExpVal::GetString((ExpVal *)&stack0xffffffffffffffc8);
      TArray<FString,_FString>::Grow(&local_68,1);
      FString::AttachToOther
                (local_68.Array + ((ulong)local_68._8_8_ >> 0x20),
                 (FString *)&stack0xffffffffffffffc8);
      local_68.Count = local_68.Count + 1;
      FString::~FString((FString *)&stack0xffffffffffffffc8);
      if (pPVar4 == TypeString) {
        FString::~FString(&local_70);
      }
      lVar12 = lVar12 + 8;
    } while ((ulong)uVar7 << 3 != lVar12);
    uVar7 = VMFunctionBuilder::AllocConstantsString(local_48,local_68.Count,local_68.Array);
    (local_50->super_FxLocalVariableDeclaration).StackOffset = uVar7;
    TArray<FString,_FString>::~TArray(&local_68);
    break;
  case '\x03':
    local_68.Array = (FString *)0x0;
    local_68.Most = 0;
    local_68.Count = 0;
    ppFVar2 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    uVar7 = (this->values).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    lVar12 = 0;
    do {
      lVar3 = *(long *)((long)ppFVar2 + lVar12);
      pPVar4 = *(PString **)(lVar3 + 0x28);
      pFVar9 = (FString *)(lVar3 + 0x30);
      if (pPVar4 == TypeString) {
        FString::AttachToOther(&local_70,pFVar9);
      }
      else {
        local_70.Chars = pFVar9->Chars;
      }
      FVar10.Chars = local_70.Chars;
      BVar1 = (pPVar4->super_PBasicType).super_PType.RegType;
      TArray<void_*,_void_*>::Grow((TArray<void_*,_void_*> *)&local_68,1);
      if (BVar1 != '\x03') {
        FVar10.Chars = (char *)0x0;
      }
      local_68.Array[local_68.Count].Chars = FVar10.Chars;
      local_68.Count = local_68.Count + 1;
      if (pPVar4 == TypeString) {
        FString::~FString(&local_70);
      }
      pFVar6 = local_50;
      lVar12 = lVar12 + 8;
    } while ((ulong)uVar7 << 3 != lVar12);
    uVar7 = VMFunctionBuilder::AllocConstantsAddress
                      (local_48,local_68.Count,&(local_68.Array)->Chars,
                       local_50->ElementType->loadOp == '\x1c');
    (pFVar6->super_FxLocalVariableDeclaration).StackOffset = uVar7;
    TArray<void_*,_void_*>::~TArray((TArray<void_*,_void_*> *)&local_68);
    break;
  default:
    __assert_fail("false && \"Invalid register type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x2789,"virtual ExpEmit FxStaticArray::Emit(VMFunctionBuilder *)");
  }
  EVar8.RegNum = 0;
  EVar8.RegType = 0x80;
  EVar8.RegCount = '\x01';
  EVar8.Konst = false;
  EVar8.Fixed = false;
  EVar8.Final = false;
  EVar8.Target = false;
  return EVar8;
}

Assistant:

ExpEmit FxStaticArray::Emit(VMFunctionBuilder *build)
{
	switch (ElementType->GetRegType())
	{
	default:
		assert(false && "Invalid register type");
		break;

	case REGT_INT:
	{
		TArray<int> cvalues;
		for (auto v : values) cvalues.Push(static_cast<FxConstant *>(v)->GetValue().GetInt());
		StackOffset = build->AllocConstantsInt(cvalues.Size(), &cvalues[0]);
		break;
	}
	case REGT_FLOAT:
	{
		TArray<double> cvalues;
		for (auto v : values) cvalues.Push(static_cast<FxConstant *>(v)->GetValue().GetFloat());
		StackOffset = build->AllocConstantsFloat(cvalues.Size(), &cvalues[0]);
		break;
	}
	case REGT_STRING:
	{
		TArray<FString> cvalues;
		for (auto v : values) cvalues.Push(static_cast<FxConstant *>(v)->GetValue().GetString());
		StackOffset = build->AllocConstantsString(cvalues.Size(), &cvalues[0]);
		break;
	}
	case REGT_POINTER:
	{
		TArray<void*> cvalues;
		for (auto v : values) cvalues.Push(static_cast<FxConstant *>(v)->GetValue().GetPointer());
		StackOffset = build->AllocConstantsAddress(cvalues.Size(), &cvalues[0], ElementType->GetLoadOp() == OP_LO ? ATAG_OBJECT : ATAG_GENERIC);
		break;
	}
	}
	return ExpEmit();
}